

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tokendif(tokcxdef *ctx,char *p,int len)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = ctx->tokcxifcnt;
  if (iVar1 == 0) {
    errlogf(ctx->tokcxerr,"TADS",0x72);
    return;
  }
  ctx->tokcxifcnt = iVar1 - 1U;
  if (1 < iVar1) {
    uVar2 = 0;
    do {
      ctx->tokcxifcur = (int)ctx->tokcxif[uVar2];
      if (ctx->tokcxif[uVar2] == '\x02') {
        return;
      }
      if (ctx->tokcxif[uVar2] == '\x04') {
        return;
      }
      uVar2 = uVar2 + 1;
    } while (iVar1 - 1U != uVar2);
  }
  return;
}

Assistant:

static void tokendif(tokcxdef *ctx, char *p, int len)
{
    /* if we're not expecting #endif, it's an error */
    if (ctx->tokcxifcnt == 0)
    {
        errlog(ctx->tokcxerr, ERR_BADENDIF);
        return;
    }

    /* remove the #if level */
    ctx->tokcxifcnt--;

    /* update the current status */
    tok_update_if_stat(ctx);
}